

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

string * __thiscall
flatbuffers::BinaryAnnotator::BuildUnion_abi_cxx11_
          (string *__return_storage_ptr__,BinaryAnnotator *this,uint64_t union_offset,
          uint8_t realized_type,Field *field)

{
  bool bVar1;
  BaseType BVar2;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this_00;
  Type *pTVar3;
  char *pcVar4;
  return_type this_01;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this_02;
  return_type this_03;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_04;
  return_type this_05;
  String *pSVar5;
  undefined7 in_register_00000009;
  int __c;
  int __c_00;
  BinaryAnnotator *__s;
  allocator<char> local_129;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  BinarySection local_70;
  
  __s = this;
  this_00 = reflection::Schema::enums(this->schema_);
  pTVar3 = reflection::Field::type(field);
  pcVar4 = reflection::Type::index(pTVar3,(char *)__s,__c);
  this_01 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(this_00,(uint)pcVar4);
  this_02 = reflection::Enum::values(this_01);
  this_03 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::Get
                      (this_02,(uint)CONCAT71(in_register_00000009,realized_type));
  pcVar4 = (char *)union_offset;
  bVar1 = ContainsSection(this,union_offset);
  if (!bVar1) {
    pTVar3 = reflection::EnumVal::union_type(this_03);
    BVar2 = reflection::Type::base_type(pTVar3);
    if (BVar2 == Obj) {
      this_04 = reflection::Schema::objects(this->schema_);
      pcVar4 = reflection::Type::index(pTVar3,pcVar4,__c_00);
      this_05 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                          (this_04,(uint)pcVar4);
      bVar1 = reflection::Object::is_struct(this_05);
      if (bVar1) {
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar5 = reflection::Field::name(field);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,(char *)(pSVar5 + 1),(allocator<char> *)&local_70);
        BuildStruct(this,union_offset,&regions,&local_90,this_05);
        std::__cxx11::string::~string((string *)&local_90);
        pSVar5 = reflection::Object::name(this_05);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,(char *)(pSVar5 + 1),&local_129);
        std::operator+(&local_d0,&local_f0,".");
        pSVar5 = reflection::Field::name(field);
        std::operator+(&local_b0,&local_d0,(char *)(pSVar5 + 1));
        local_108.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start =
             regions.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             regions.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_108.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             regions.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_45::MakeBinarySection(&local_70,&local_b0,Union,&local_108);
        AddSection(this,union_offset,&local_70);
        BinarySection::~BinarySection(&local_70);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_108);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&regions);
      }
      else {
        BuildTable(this,union_offset,Table,this_05);
      }
    }
  }
  pSVar5 = reflection::EnumVal::name(this_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)(pSVar5 + 1),(allocator<char> *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryAnnotator::BuildUnion(const uint64_t union_offset,
                                        const uint8_t realized_type,
                                        const reflection::Field *const field) {
  const reflection::Enum *next_enum =
      schema_->enums()->Get(field->type()->index());

  const reflection::EnumVal *enum_val = next_enum->values()->Get(realized_type);

  if (ContainsSection(union_offset)) { return enum_val->name()->c_str(); }

  const reflection::Type *union_type = enum_val->union_type();

  if (union_type->base_type() == reflection::BaseType::Obj) {
    const reflection::Object *object =
        schema_->objects()->Get(union_type->index());

    if (object->is_struct()) {
      // Union of vectors point to a new Binary section
      std::vector<BinaryRegion> regions;

      BuildStruct(union_offset, regions, field->name()->c_str(), object);

      AddSection(
          union_offset,
          MakeBinarySection(std::string(object->name()->c_str()) + "." +
                                field->name()->c_str(),
                            BinarySectionType::Union, std::move(regions)));
    } else {
      BuildTable(union_offset, BinarySectionType::Table, object);
    }
  }
  // TODO(dbaileychess): handle the other union types.

  return enum_val->name()->c_str();
}